

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

CURLcode Curl_sasl_start(SASL *sasl,connectdata *conn,_Bool force_ir,saslprogress *progress)

{
  SessionHandle *data;
  ulong uVar1;
  uint uVar2;
  CURLcode CVar3;
  size_t sVar4;
  char *__s;
  char *pcVar5;
  char *resp;
  size_t len;
  saslstate local_48;
  saslstate local_44;
  char *local_40;
  size_t local_38;
  
  data = conn->data;
  CVar3 = CURLE_OK;
  local_40 = (char *)0x0;
  local_38 = 0;
  sasl->force_ir = force_ir;
  sasl->authused = 0;
  uVar2 = sasl->prefmech & sasl->authmechs;
  *progress = SASL_IDLE;
  if (((uVar2 & 0x20) != 0) && (*conn->passwd == '\0')) {
    sasl->authused = 0x20;
    if ((force_ir) || ((data->set).sasl_ir == true)) {
      CVar3 = sasl_create_login_message(data,conn->user,&local_40,&local_38);
      local_48 = SASL_FINAL;
      local_44 = SASL_EXTERNAL;
      __s = "EXTERNAL";
      goto LAB_0058122e;
    }
    __s = "EXTERNAL";
    local_44 = SASL_EXTERNAL;
    goto LAB_005812b4;
  }
  if ((conn->bits).user_passwd != true) goto LAB_005812f1;
  if ((uVar2 & 8) == 0) {
    if ((uVar2 & 4) != 0) {
      sasl->authused = 4;
      __s = "CRAM-MD5";
      local_44 = SASL_CRAMMD5;
      goto LAB_005812b4;
    }
    if (((char)uVar2 < '\0') || (conn->xoauth2_bearer != (char *)0x0)) {
      sasl->authused = 0x80;
      if ((force_ir) || ((data->set).sasl_ir == true)) {
        CVar3 = sasl_create_xoauth2_message
                          (data,conn->user,conn->xoauth2_bearer,&local_40,&local_38);
        local_48 = SASL_FINAL;
        local_44 = SASL_XOAUTH2;
        __s = "XOAUTH2";
        goto LAB_0058122e;
      }
      __s = "XOAUTH2";
      local_44 = SASL_XOAUTH2;
      goto LAB_005812b4;
    }
    if ((uVar2 & 1) != 0) {
      sasl->authused = 1;
      if ((force_ir) || ((data->set).sasl_ir == true)) {
        CVar3 = sasl_create_login_message(data,conn->user,&local_40,&local_38);
        local_48 = SASL_LOGIN_PASSWD;
        local_44 = SASL_LOGIN;
        __s = "LOGIN";
        goto LAB_0058122e;
      }
      __s = "LOGIN";
      local_44 = SASL_LOGIN;
      local_48 = SASL_LOGIN_PASSWD;
      goto LAB_005812bb;
    }
    if ((uVar2 & 2) != 0) {
      sasl->authused = 2;
      if ((!force_ir) && ((data->set).sasl_ir != true)) {
        __s = "PLAIN";
        local_44 = SASL_PLAIN;
        goto LAB_005812b4;
      }
      CVar3 = sasl_create_plain_message(data,conn->user,conn->passwd,&local_40,&local_38);
      local_48 = SASL_FINAL;
      local_44 = SASL_PLAIN;
      __s = "PLAIN";
LAB_0058122e:
      pcVar5 = local_40;
      if (CVar3 != CURLE_OK) goto LAB_005812f1;
      if (local_40 == (char *)0x0) goto LAB_005812bb;
      uVar1 = sasl->params->maxirlen;
      if ((uVar1 != 0) && (sVar4 = strlen(__s), uVar1 < sVar4 + local_38)) {
        (*Curl_cfree)(pcVar5);
        local_40 = (char *)0x0;
        goto LAB_005812bb;
      }
      goto LAB_005812be;
    }
  }
  else {
    sasl->authused = 8;
    __s = "DIGEST-MD5";
    local_44 = SASL_DIGESTMD5;
LAB_005812b4:
    local_48 = SASL_FINAL;
LAB_005812bb:
    pcVar5 = (char *)0x0;
LAB_005812be:
    CVar3 = (*sasl->params->sendauth)(conn,__s,pcVar5);
    if (CVar3 != CURLE_OK) goto LAB_005812f1;
    *progress = SASL_INPROGRESS;
    if (local_40 == (char *)0x0) {
      local_48 = local_44;
    }
    sasl->state = local_48;
  }
  CVar3 = CURLE_OK;
LAB_005812f1:
  (*Curl_cfree)(local_40);
  return CVar3;
}

Assistant:

CURLcode Curl_sasl_start(struct SASL *sasl, struct connectdata *conn,
                         bool force_ir, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  unsigned int enabledmechs;
  const char *mech = NULL;
  char *resp = NULL;
  size_t len = 0;
  saslstate state1 = SASL_STOP;
  saslstate state2 = SASL_FINAL;

  sasl->force_ir = force_ir;    /* Latch for future use */
  sasl->authused = 0;           /* No mechanism used yet */
  enabledmechs = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
  if((enabledmechs & SASL_MECH_EXTERNAL) && !conn->passwd[0]) {
    mech = SASL_MECH_STRING_EXTERNAL;
    state1 = SASL_EXTERNAL;
    sasl->authused = SASL_MECH_EXTERNAL;

    if(force_ir || data->set.sasl_ir)
      result = sasl_create_external_message(data, conn->user, &resp, &len);
  }
  else if(conn->bits.user_passwd) {
#if defined(USE_KERBEROS5)
    if(enabledmechs & SASL_MECH_GSSAPI) {
      sasl->mutual_auth = FALSE; /* TODO: Calculate mutual authentication */
      mech = SASL_MECH_STRING_GSSAPI;
      state1 = SASL_GSSAPI;
      state2 = SASL_GSSAPI_TOKEN;
      sasl->authused = SASL_MECH_GSSAPI;

      if(force_ir || data->set.sasl_ir)
        result = Curl_sasl_create_gssapi_user_message(data, conn->user,
                                                      conn->passwd,
                                                      sasl->params->service,
                                                      sasl->mutual_auth,
                                                      NULL, &conn->krb5,
                                                      &resp, &len);
    }
    else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
    if(enabledmechs & SASL_MECH_DIGEST_MD5) {
      mech = SASL_MECH_STRING_DIGEST_MD5;
      state1 = SASL_DIGESTMD5;
      sasl->authused = SASL_MECH_DIGEST_MD5;
    }
    else if(enabledmechs & SASL_MECH_CRAM_MD5) {
      mech = SASL_MECH_STRING_CRAM_MD5;
      state1 = SASL_CRAMMD5;
      sasl->authused = SASL_MECH_CRAM_MD5;
    }
    else
#endif
#ifdef USE_NTLM
    if(enabledmechs & SASL_MECH_NTLM) {
      mech = SASL_MECH_STRING_NTLM;
      state1 = SASL_NTLM;
      state2 = SASL_NTLM_TYPE2MSG;
      sasl->authused = SASL_MECH_NTLM;

      if(force_ir || data->set.sasl_ir)
        result = Curl_sasl_create_ntlm_type1_message(conn->user, conn->passwd,
                                                     &conn->ntlm, &resp, &len);
      }
    else
#endif
    if((enabledmechs & SASL_MECH_XOAUTH2) || conn->xoauth2_bearer) {
      mech = SASL_MECH_STRING_XOAUTH2;
      state1 = SASL_XOAUTH2;
      sasl->authused = SASL_MECH_XOAUTH2;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_xoauth2_message(data, conn->user,
                                             conn->xoauth2_bearer,
                                             &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_LOGIN) {
      mech = SASL_MECH_STRING_LOGIN;
      state1 = SASL_LOGIN;
      state2 = SASL_LOGIN_PASSWD;
      sasl->authused = SASL_MECH_LOGIN;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_login_message(data, conn->user, &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_PLAIN) {
      mech = SASL_MECH_STRING_PLAIN;
      state1 = SASL_PLAIN;
      sasl->authused = SASL_MECH_PLAIN;

      if(force_ir || data->set.sasl_ir)
        result = sasl_create_plain_message(data, conn->user, conn->passwd,
                                           &resp, &len);
    }
  }

  if(!result) {
    if(resp && sasl->params->maxirlen &&
       strlen(mech) + len > sasl->params->maxirlen) {
      free(resp);
      resp = NULL;
    }

    if(mech) {
      result = sasl->params->sendauth(conn, mech, resp);
      if(!result) {
        *progress = SASL_INPROGRESS;
        state(sasl, conn, resp? state2: state1);
      }
    }
  }

  free(resp);

  return result;
}